

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::OurReader::readArray(OurReader *this,Token *tokenStart)

{
  bool bVar1;
  byte *pbVar2;
  _Elt_pointer ppVVar3;
  int index;
  Token endArray;
  Token token;
  Value init;
  undefined1 local_90 [32];
  Token local_70;
  Value local_58;
  
  Value::Value(&local_58,arrayValue);
  ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar3 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::swapPayload(ppVVar3[-1],&local_58);
  ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar3 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::setOffsetStart(ppVVar3[-1],(long)tokenStart->start_ - (long)this->begin_);
  pbVar2 = (byte *)this->current_;
  while (((pbVar2 != (byte *)this->end_ && ((ulong)*pbVar2 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
    pbVar2 = pbVar2 + 1;
    this->current_ = (Location)pbVar2;
  }
  if ((pbVar2 == (byte *)this->end_) || (*pbVar2 != 0x5d)) {
    index = 0;
    do {
      ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVVar3 ==
          (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      local_90._0_8_ = Value::operator[](ppVVar3[-1],index);
      std::deque<Json::Value*,std::allocator<Json::Value*>>::emplace_back<Json::Value*>
                ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)local_90);
      bVar1 = readValue(this);
      std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
                ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
      if (!bVar1) {
        recoverFromError(this,tokenArrayEnd);
        goto LAB_00455452;
      }
      readToken(this,&local_70);
      index = index + 1;
      while (local_70.type_ == tokenComment) {
        readToken(this,&local_70);
      }
      if (local_70.type_ == tokenArrayEnd) goto LAB_00455363;
    } while (local_70.type_ == tokenArraySeparator);
    local_90._0_8_ = (Value *)(local_90 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,"Missing \',\' or \']\' in array declaration","");
    addError(this,(string *)local_90,&local_70,(Location)0x0);
    recoverFromError(this,tokenArrayEnd);
    if ((Value *)local_90._0_8_ != (Value *)(local_90 + 0x10)) {
      operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
    }
LAB_00455452:
    bVar1 = false;
  }
  else {
    readToken(this,(Token *)local_90);
LAB_00455363:
    bVar1 = true;
  }
  Value::~Value(&local_58);
  return bVar1;
}

Assistant:

bool OurReader::readArray(Token& tokenStart) {
  Value init(arrayValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  skipSpaces();
  if (current_ != end_ && *current_ == ']') // empty array
  {
    Token endArray;
    readToken(endArray);
    return true;
  }
  int index = 0;
  for (;;) {
    Value& value = currentValue()[index++];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenArrayEnd);

    Token token;
    // Accept Comment after last item in the array.
    ok = readToken(token);
    while (token.type_ == tokenComment && ok) {
      ok = readToken(token);
    }
    bool badTokenType =
        (token.type_ != tokenArraySeparator && token.type_ != tokenArrayEnd);
    if (!ok || badTokenType) {
      return addErrorAndRecover(
          "Missing ',' or ']' in array declaration", token, tokenArrayEnd);
    }
    if (token.type_ == tokenArrayEnd)
      break;
  }
  return true;
}